

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void test1(void)

{
  socklen_t in_ECX;
  slot<void_()> local_98;
  undefined1 local_60 [24];
  undefined1 local_48 [7];
  HelloWorld hello;
  sigslot<void_()> sig;
  
  utils::sigslot<void_()>::sigslot((sigslot<void_()> *)local_48);
  utils::detail::slot<void_()>::slot<HelloWorld>(&local_98,(HelloWorld *)(local_60 + 0x17));
  utils::sigslot<void_()>::connect
            ((sigslot<void_()> *)local_60,(int)local_48,(sockaddr *)&local_98,in_ECX);
  std::weak_ptr<utils::detail::slot<void_()>_>::~weak_ptr
            ((weak_ptr<utils::detail::slot<void_()>_> *)local_60);
  utils::detail::slot<void_()>::~slot(&local_98);
  utils::sigslot<void_()>::operator()<>((sigslot<void_()> *)local_48);
  utils::sigslot<void_()>::~sigslot((sigslot<void_()> *)local_48);
  return;
}

Assistant:

void test1()
{
    utils::sigslot<void()> sig;
    HelloWorld hello;
    sig.connect(hello);
    sig();
}